

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaVErrFull(xmlSchemaValidCtxtPtr ctxt,xmlNodePtr node,int code,xmlErrorLevel level,
                      char *file,int line,xmlChar *str1,xmlChar *str2,xmlChar *str3,int col,
                      char *msg,...)

{
  char in_AL;
  int iVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined1 local_98 [8];
  va_list ap;
  void *pvStack_70;
  int res;
  void *data;
  xmlStructuredErrorFunc schannel;
  xmlGenericErrorFunc channel;
  int line_local;
  char *file_local;
  xmlErrorLevel level_local;
  int code_local;
  xmlNodePtr node_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  schannel = (xmlStructuredErrorFunc)0x0;
  data = (void *)0x0;
  pvStack_70 = (void *)0x0;
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    if (ctxt->err == 2) {
      return;
    }
    if (level == XML_ERR_WARNING) {
      schannel = (xmlStructuredErrorFunc)ctxt->warning;
    }
    else {
      ctxt->nberrors = ctxt->nberrors + 1;
      ctxt->err = code;
      schannel = (xmlStructuredErrorFunc)ctxt->error;
    }
    pvStack_70 = ctxt->errCtxt;
    data = ctxt->serror;
  }
  if ((schannel == (xmlStructuredErrorFunc)0x0) && (data == (void *)0x0)) {
    pp_Var2 = __xmlGenericError();
    schannel = (xmlStructuredErrorFunc)*pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    pvStack_70 = *ppvVar3;
  }
  ap[0].overflow_arg_area = local_148;
  ap[0]._0_8_ = &stack0x00000030;
  local_98._4_4_ = 0x30;
  local_98._0_4_ = 0x30;
  iVar1 = xmlVRaiseError((xmlStructuredErrorFunc)data,(xmlGenericErrorFunc)schannel,pvStack_70,ctxt,
                         node,0x11,code,level,file,line,(char *)str1,(char *)str2,(char *)str3,0,col
                         ,msg,(__va_list_tag *)local_98);
  if (iVar1 < 0) {
    xmlSchemaVErrMemory(ctxt);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(11,12)
xmlSchemaVErrFull(xmlSchemaValidCtxtPtr ctxt, xmlNodePtr node, int code,
                  xmlErrorLevel level, const char *file, int line,
                  const xmlChar *str1, const xmlChar *str2, const xmlChar *str3,
                  int col, const char *msg, ...) {
    xmlGenericErrorFunc channel = NULL;
    xmlStructuredErrorFunc schannel = NULL;
    void *data = NULL;
    int res;
    va_list ap;

    if (ctxt != NULL) {
        /* Don't overwrite memory errors */
        if (ctxt->err == XML_ERR_NO_MEMORY)
            return;

        if (level == XML_ERR_WARNING) {
            channel = ctxt->warning;
        } else {
            ctxt->nberrors++;
            ctxt->err = code;
            channel = ctxt->error;
        }
        data = ctxt->errCtxt;
        schannel = ctxt->serror;
    }